

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void __thiscall
duckdb::CopyToFunctionLocalState::SetDataWithoutPartitions
          (CopyToFunctionLocalState *this,DataChunk *chunk,DataChunk *source,
          vector<duckdb::LogicalType,_true> *col_types,vector<unsigned_long,_true> *part_cols)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Base_ptr p_Var3;
  reference this_00;
  const_reference other;
  pointer pVVar4;
  pointer pVVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong __n;
  size_type __n_00;
  vector<duckdb::LogicalType,_true> types;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> part_col_set;
  vector<duckdb::LogicalType,_true> vStack_78;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  LogicalCopyToFile::GetTypesWithoutPartitions(&vStack_78,col_types,part_cols,false);
  DataChunk::InitializeEmpty(chunk,&vStack_78);
  ::std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)&local_60,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  pVVar4 = (source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar5 != pVVar4) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    __n_00 = 0;
    __n = 0;
    do {
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_016cf891:
        this_00 = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n_00);
        other = vector<duckdb::Vector,_true>::operator[](&source->data,__n);
        Vector::Reference(this_00,other);
        __n_00 = __n_00 + 1;
        pVVar4 = (source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar5 = (source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        do {
          p_Var7 = p_Var8;
          p_Var6 = p_Var3;
          uVar2 = *(ulong *)(p_Var6 + 1);
          p_Var8 = p_Var6;
          if (uVar2 < __n) {
            p_Var8 = p_Var7;
          }
          p_Var3 = (&p_Var6->_M_left)[uVar2 < __n];
        } while ((&p_Var6->_M_left)[uVar2 < __n] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var8 == p_Var1) goto LAB_016cf891;
        if (uVar2 < __n) {
          p_Var6 = p_Var7;
        }
        if (__n < *(ulong *)(p_Var6 + 1)) goto LAB_016cf891;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)pVVar5 - (long)pVVar4 >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  chunk->count = source->count;
  ::std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&vStack_78);
  return;
}

Assistant:

void SetDataWithoutPartitions(DataChunk &chunk, const DataChunk &source, const vector<LogicalType> &col_types,
	                              const vector<idx_t> &part_cols) {
		D_ASSERT(source.ColumnCount() == col_types.size());
		auto types = LogicalCopyToFile::GetTypesWithoutPartitions(col_types, part_cols, false);
		chunk.InitializeEmpty(types);
		set<idx_t> part_col_set(part_cols.begin(), part_cols.end());
		idx_t new_col_id = 0;
		for (idx_t col_idx = 0; col_idx < source.ColumnCount(); col_idx++) {
			if (part_col_set.find(col_idx) == part_col_set.end()) {
				chunk.data[new_col_id].Reference(source.data[col_idx]);
				new_col_id++;
			}
		}
		chunk.SetCardinality(source.size());
	}